

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O0

void WebPPictureFree(WebPPicture *picture)

{
  long in_RDI;
  
  if (in_RDI != 0) {
    WebPSafeFree((void *)0x155cac);
    WebPSafeFree((void *)0x155cbc);
    WebPPictureResetBuffers((WebPPicture *)0x155cc5);
  }
  return;
}

Assistant:

void WebPPictureFree(WebPPicture* picture) {
  if (picture != NULL) {
    WebPSafeFree(picture->memory_);
    WebPSafeFree(picture->memory_argb_);
    WebPPictureResetBuffers(picture);
  }
}